

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineSpecConstantTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::pipeline::anon_unknown_0::GraphicsTestInstance::iterate
          (TestStatus *__return_storage_ptr__,GraphicsTestInstance *this)

{
  undefined8 *puVar1;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var2;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  IVec2 pipelineLayout;
  IVec2 obj;
  IVec2 commandBuffer;
  Handle<(vk::HandleType)14> HVar3;
  DeviceInterface *pDVar4;
  VkDevice pVVar5;
  Allocation *pAVar6;
  bool bVar7;
  deUint32 queueFamilyIndex;
  VkResult result;
  DeviceInterface *vk;
  VkDevice device;
  Allocator *allocator;
  DescriptorSetLayoutBuilder *this_00;
  DescriptorPoolBuilder *this_01;
  DescriptorSetUpdateBuilder *this_02;
  const_iterator cVar8;
  GraphicsPipelineBuilder *pGVar9;
  VkSpecializationInfo *specInfo;
  undefined1 local_408 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f8;
  VkImageMemoryBarrier barrierColorAttachmentSetInitialLayout;
  IVec2 renderSize;
  int local_368 [2];
  long *plStack_360;
  DeviceInterface *local_358;
  VkDevice pVStack_350;
  VkRenderPass local_348;
  Deleter<vk::Handle<(vk::HandleType)17>_> DStack_340;
  VkQueue local_328;
  VkDeviceSize vertexBufferOffset;
  Specialization specialization;
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_2c0;
  VkDescriptorSetLayout local_2a8;
  Deleter<vk::Handle<(vk::HandleType)19>_> DStack_2a0;
  GraphicsPipelineBuilder pipelineBuilder;
  VkImageSubresourceRange res;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_180;
  VkFramebuffer local_168;
  Deleter<vk::Handle<(vk::HandleType)23>_> DStack_160;
  VkDescriptorPool local_148;
  Deleter<vk::Handle<(vk::HandleType)21>_> DStack_140;
  Buffer resultBuffer;
  VkImageView local_f8;
  Deleter<vk::Handle<(vk::HandleType)13>_> DStack_f0;
  VkRect2D renderArea;
  Buffer vertexBuffer;
  VkDescriptorBufferInfo descriptorBufferInfo;
  Image colorImage;
  Vec4 clearColor;
  
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  local_328 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  allocator = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  renderSize.m_data[0] = 0x20;
  renderSize.m_data[1] = 0x20;
  makeImageCreateInfo((VkImageCreateInfo *)&pipelineBuilder,&renderSize,VK_FORMAT_R8G8B8A8_UNORM,
                      0x10);
  Image::Image(&colorImage,vk,device,allocator,(VkImageCreateInfo *)&pipelineBuilder,
               (MemoryRequirement)0x0);
  subresourceRange.levelCount = 1;
  subresourceRange.aspectMask = 1;
  subresourceRange.baseMipLevel = 0;
  subresourceRange.baseArrayLayer = 0;
  subresourceRange.layerCount = 1;
  makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&pipelineBuilder,vk,device,
                (VkImage)colorImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                         object.m_internal,VK_IMAGE_VIEW_TYPE_2D,VK_FORMAT_R8G8B8A8_UNORM,
                subresourceRange);
  DStack_f0.m_device =
       (VkDevice)
       pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
       deleter.m_deviceIface;
  DStack_f0.m_allocator =
       (VkAllocationCallbacks *)
       pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
       deleter.m_device;
  local_f8.m_internal._0_4_ = pipelineBuilder.m_renderSize.m_data[0];
  local_f8.m_internal._4_4_ = pipelineBuilder.m_renderSize.m_data[1];
  DStack_f0.m_deviceIface =
       (DeviceInterface *)
       pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
       object.m_internal;
  makeBufferCreateInfo((VkBufferCreateInfo *)&pipelineBuilder,0x30,0x80);
  pipeline::Buffer::Buffer
            (&vertexBuffer,vk,device,allocator,(VkBufferCreateInfo *)&pipelineBuilder,
             (MemoryRequirement)0x1);
  puVar1 = (undefined8 *)
           (vertexBuffer.m_allocation.
            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
           m_hostPtr;
  *puVar1 = 0xbf800000bf800000;
  puVar1[1] = 0x3f80000000000000;
  puVar1[2] = 0x3f800000bf800000;
  puVar1[3] = 0x3f80000000000000;
  puVar1[4] = 0xbf8000003f800000;
  puVar1[5] = 0x3f80000000000000;
  ::vk::flushMappedMemoryRange
            (vk,device,
             (VkDeviceMemory)
             ((vertexBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (vertexBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,0x30);
  makeBufferCreateInfo((VkBufferCreateInfo *)&pipelineBuilder,this->m_ssboSize,0x20);
  pipeline::Buffer::Buffer
            (&resultBuffer,vk,device,allocator,(VkBufferCreateInfo *)&pipelineBuilder,
             (MemoryRequirement)0x1);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)&pipelineBuilder);
  this_00 = ::vk::DescriptorSetLayoutBuilder::addBinding
                      ((DescriptorSetLayoutBuilder *)&pipelineBuilder,
                       VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1,0x1f,(VkSampler *)0x0);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&specialization,this_00,vk,device,0);
  DStack_2a0.m_device =
       (VkDevice)
       specialization.m_data.
       super__Vector_base<vkt::pipeline::(anonymous_namespace)::GenericValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::GenericValue>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  DStack_2a0.m_allocator =
       (VkAllocationCallbacks *)
       specialization.m_entries.
       super__Vector_base<vk::VkSpecializationMapEntry,_std::allocator<vk::VkSpecializationMapEntry>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_2a8.m_internal =
       (deUint64)
       specialization.m_data.
       super__Vector_base<vkt::pipeline::(anonymous_namespace)::GenericValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::GenericValue>_>
       ._M_impl.super__Vector_impl_data._M_start;
  DStack_2a0.m_deviceIface =
       (DeviceInterface *)
       specialization.m_data.
       super__Vector_base<vkt::pipeline::(anonymous_namespace)::GenericValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::GenericValue>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  specialization.m_data.
  super__Vector_base<vkt::pipeline::(anonymous_namespace)::GenericValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::GenericValue>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  specialization.m_data.
  super__Vector_base<vkt::pipeline::(anonymous_namespace)::GenericValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::GenericValue>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  specialization.m_data.
  super__Vector_base<vkt::pipeline::(anonymous_namespace)::GenericValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::GenericValue>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  specialization.m_entries.
  super__Vector_base<vk::VkSpecializationMapEntry,_std::allocator<vk::VkSpecializationMapEntry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (pipelineBuilder.m_fragmentShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
      deleter.m_deviceIface != (DeviceInterface *)0x0) {
    operator_delete(pipelineBuilder.m_fragmentShaderModule.
                    super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_deviceIface,
                    (long)pipelineBuilder.m_fragmentShaderModule.
                          super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator
                    - (long)pipelineBuilder.m_fragmentShaderModule.
                            super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                            m_deviceIface);
  }
  if (pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
      deleter.m_device != (VkDevice)0x0) {
    operator_delete(pipelineBuilder.m_vertexShaderModule.
                    super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device,
                    pipelineBuilder.m_fragmentShaderModule.
                    super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal -
                    (long)pipelineBuilder.m_vertexShaderModule.
                          super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device);
  }
  if (pipelineBuilder.m_renderSize.m_data != (int  [2])0x0) {
    operator_delete((void *)pipelineBuilder.m_renderSize.m_data,
                    (long)pipelineBuilder.m_vertexShaderModule.
                          super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                          m_deviceIface - (long)pipelineBuilder.m_renderSize.m_data);
  }
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&specialization);
  this_01 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&specialization,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1)
  ;
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&pipelineBuilder,this_01,vk,device,1,1);
  DStack_140.m_device =
       (VkDevice)
       pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
       deleter.m_deviceIface;
  DStack_140.m_allocator =
       (VkAllocationCallbacks *)
       pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
       deleter.m_device;
  local_148.m_internal._0_4_ = pipelineBuilder.m_renderSize.m_data[0];
  local_148.m_internal._4_4_ = pipelineBuilder.m_renderSize.m_data[1];
  DStack_140.m_deviceIface =
       (DeviceInterface *)
       pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
       object.m_internal;
  pipelineBuilder.m_renderSize.m_data[0] = 0;
  pipelineBuilder.m_renderSize.m_data[1] = 0;
  pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
  m_internal = 0;
  pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter
  .m_deviceIface = (DeviceInterface *)0x0;
  pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter
  .m_device = (VkDevice)0x0;
  if (specialization.m_data.
      super__Vector_base<vkt::pipeline::(anonymous_namespace)::GenericValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::GenericValue>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(specialization.m_data.
                    super__Vector_base<vkt::pipeline::(anonymous_namespace)::GenericValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::GenericValue>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)specialization.m_data.
                          super__Vector_base<vkt::pipeline::(anonymous_namespace)::GenericValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::GenericValue>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)specialization.m_data.
                          super__Vector_base<vkt::pipeline::(anonymous_namespace)::GenericValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::GenericValue>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&pipelineBuilder,vk,device,local_148,
                    local_2a8);
  local_358 = pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.
              m_data.deleter.m_deviceIface;
  pVStack_350 = pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.
                m_data.deleter.m_device;
  local_368[0] = pipelineBuilder.m_renderSize.m_data[0];
  local_368[1] = pipelineBuilder.m_renderSize.m_data[1];
  plStack_360 = (long *)pipelineBuilder.m_vertexShaderModule.
                        super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&pipelineBuilder);
  this_02 = (DescriptorSetUpdateBuilder *)
            ::vk::DescriptorSetUpdateBuilder::write
                      ((DescriptorSetUpdateBuilder *)&pipelineBuilder,local_368[0],(void *)0x0,0);
  ::vk::DescriptorSetUpdateBuilder::update(this_02,vk,device);
  if (pipelineBuilder.m_fragmentShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
      deleter.m_deviceIface != (DeviceInterface *)0x0) {
    operator_delete(pipelineBuilder.m_fragmentShaderModule.
                    super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_deviceIface,
                    (long)pipelineBuilder.m_fragmentShaderModule.
                          super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator
                    - (long)pipelineBuilder.m_fragmentShaderModule.
                            super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                            m_deviceIface);
  }
  if (pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
      deleter.m_device != (VkDevice)0x0) {
    operator_delete(pipelineBuilder.m_vertexShaderModule.
                    super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device,
                    pipelineBuilder.m_fragmentShaderModule.
                    super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal -
                    (long)pipelineBuilder.m_vertexShaderModule.
                          super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device);
  }
  std::
  vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ::~vector((vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
             *)&pipelineBuilder);
  Specialization::Specialization(&specialization,&this->m_specConstants);
  specInfo = (VkSpecializationInfo *)0x0;
  if (specialization.m_entries.
      super__Vector_base<vk::VkSpecializationMapEntry,_std::allocator<vk::VkSpecializationMapEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      specialization.m_entries.
      super__Vector_base<vk::VkSpecializationMapEntry,_std::allocator<vk::VkSpecializationMapEntry>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    specInfo = &specialization.m_specialization;
  }
  pipeline::makeRenderPass
            ((Move<vk::Handle<(vk::HandleType)17>_> *)&pipelineBuilder,vk,device,
             VK_FORMAT_R8G8B8A8_UNORM);
  DStack_340.m_device =
       (VkDevice)
       pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
       deleter.m_deviceIface;
  DStack_340.m_allocator =
       (VkAllocationCallbacks *)
       pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
       deleter.m_device;
  local_348.m_internal._0_4_ = pipelineBuilder.m_renderSize.m_data[0];
  local_348.m_internal._4_4_ = pipelineBuilder.m_renderSize.m_data[1];
  DStack_340.m_deviceIface =
       (DeviceInterface *)
       pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
       object.m_internal;
  makeFramebuffer((Move<vk::Handle<(vk::HandleType)23>_> *)&pipelineBuilder,vk,device,
                  (VkRenderPass)pipelineBuilder.m_renderSize.m_data,1,&local_f8,renderSize.m_data[0]
                  ,renderSize.m_data[1],1);
  DStack_160.m_device =
       (VkDevice)
       pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
       deleter.m_deviceIface;
  DStack_160.m_allocator =
       (VkAllocationCallbacks *)
       pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
       deleter.m_device;
  local_168.m_internal._0_4_ = pipelineBuilder.m_renderSize.m_data[0];
  local_168.m_internal._4_4_ = pipelineBuilder.m_renderSize.m_data[1];
  DStack_160.m_deviceIface =
       (DeviceInterface *)
       pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
       object.m_internal;
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&pipelineBuilder,vk,device,local_2a8);
  pipelineLayout = pipelineBuilder.m_renderSize;
  DStack_2c0.m_device =
       (VkDevice)
       pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
       deleter.m_deviceIface;
  DStack_2c0.m_allocator =
       (VkAllocationCallbacks *)
       pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
       deleter.m_device;
  DStack_2c0.m_deviceIface =
       (DeviceInterface *)
       pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
       object.m_internal;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&pipelineBuilder,vk,device,2,queueFamilyIndex,
             (VkAllocationCallbacks *)0x0);
  obj = pipelineBuilder.m_renderSize;
  DStack_180.m_device =
       (VkDevice)
       pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
       deleter.m_deviceIface;
  DStack_180.m_allocator =
       (VkAllocationCallbacks *)
       pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
       deleter.m_device;
  DStack_180.m_deviceIface =
       (DeviceInterface *)
       pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
       object.m_internal;
  makeCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)&pipelineBuilder,vk,device,
                    (VkCommandPool)pipelineBuilder.m_renderSize.m_data);
  pVVar5 = pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.
           m_data.deleter.m_device;
  pDVar4 = pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.
           m_data.deleter.m_deviceIface;
  HVar3 = pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data
          .object;
  commandBuffer = pipelineBuilder.m_renderSize;
  pipelineBuilder.m_renderSize.m_data[0] = 0x10;
  pipelineBuilder.m_renderSize.m_data[1] = 0x10;
  memset(&pipelineBuilder.m_vertexShaderModule,0,0xbc);
  pipelineBuilder.m_renderSize = renderSize;
  p_Var2 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)((this->super_TestInstance).m_context)->m_progCollection;
  barrierColorAttachmentSetInitialLayout._0_8_ =
       &barrierColorAttachmentSetInitialLayout.srcAccessMask;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&barrierColorAttachmentSetInitialLayout,"vert","");
  cVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find(p_Var2,(key_type *)&barrierColorAttachmentSetInitialLayout);
  pGVar9 = GraphicsPipelineBuilder::setShader
                     (&pipelineBuilder,vk,device,VK_SHADER_STAGE_VERTEX_BIT,
                      *(ProgramBinary **)(cVar8._M_node + 2),specInfo);
  p_Var2 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)((this->super_TestInstance).m_context)->m_progCollection;
  local_408._0_8_ = &local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"frag","");
  cVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find(p_Var2,(key_type *)local_408);
  GraphicsPipelineBuilder::setShader
            (pGVar9,vk,device,VK_SHADER_STAGE_FRAGMENT_BIT,*(ProgramBinary **)(cVar8._M_node + 2),
             specInfo);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._0_8_ != &local_3f8) {
    operator_delete((void *)local_408._0_8_,local_3f8._M_allocated_capacity + 1);
  }
  if ((VkAccessFlags *)barrierColorAttachmentSetInitialLayout._0_8_ !=
      &barrierColorAttachmentSetInitialLayout.srcAccessMask) {
    operator_delete((void *)barrierColorAttachmentSetInitialLayout._0_8_,
                    barrierColorAttachmentSetInitialLayout._16_8_ + 1);
  }
  if ((this->m_stage == VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT) ||
     (this->m_stage == VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT)) {
    p_Var2 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
              *)((this->super_TestInstance).m_context)->m_progCollection;
    barrierColorAttachmentSetInitialLayout._0_8_ =
         &barrierColorAttachmentSetInitialLayout.srcAccessMask;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&barrierColorAttachmentSetInitialLayout,"tesc","");
    cVar8 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            ::find(p_Var2,(key_type *)&barrierColorAttachmentSetInitialLayout);
    pGVar9 = GraphicsPipelineBuilder::setShader
                       (&pipelineBuilder,vk,device,VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,
                        *(ProgramBinary **)(cVar8._M_node + 2),specInfo);
    p_Var2 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
              *)((this->super_TestInstance).m_context)->m_progCollection;
    local_408._0_8_ = &local_3f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"tese","");
    cVar8 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            ::find(p_Var2,(key_type *)local_408);
    GraphicsPipelineBuilder::setShader
              (pGVar9,vk,device,VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,
               *(ProgramBinary **)(cVar8._M_node + 2),specInfo);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._0_8_ != &local_3f8) {
      operator_delete((void *)local_408._0_8_,local_3f8._M_allocated_capacity + 1);
    }
    if ((VkAccessFlags *)barrierColorAttachmentSetInitialLayout._0_8_ !=
        &barrierColorAttachmentSetInitialLayout.srcAccessMask) {
      operator_delete((void *)barrierColorAttachmentSetInitialLayout._0_8_,
                      barrierColorAttachmentSetInitialLayout._16_8_ + 1);
    }
  }
  if (this->m_stage == VK_SHADER_STAGE_GEOMETRY_BIT) {
    p_Var2 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
              *)((this->super_TestInstance).m_context)->m_progCollection;
    barrierColorAttachmentSetInitialLayout._0_8_ =
         &barrierColorAttachmentSetInitialLayout.srcAccessMask;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&barrierColorAttachmentSetInitialLayout,"geom","");
    cVar8 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            ::find(p_Var2,(key_type *)&barrierColorAttachmentSetInitialLayout);
    GraphicsPipelineBuilder::setShader
              (&pipelineBuilder,vk,device,VK_SHADER_STAGE_GEOMETRY_BIT,
               *(ProgramBinary **)(cVar8._M_node + 2),specInfo);
    if ((VkAccessFlags *)barrierColorAttachmentSetInitialLayout._0_8_ !=
        &barrierColorAttachmentSetInitialLayout.srcAccessMask) {
      operator_delete((void *)barrierColorAttachmentSetInitialLayout._0_8_,
                      barrierColorAttachmentSetInitialLayout._16_8_ + 1);
    }
  }
  GraphicsPipelineBuilder::build
            ((Move<vk::Handle<(vk::HandleType)18>_> *)&barrierColorAttachmentSetInitialLayout,
             &pipelineBuilder,vk,device,(VkPipelineLayout)pipelineLayout.m_data,local_348);
  local_3f8._M_allocated_capacity._0_4_ = barrierColorAttachmentSetInitialLayout.srcAccessMask;
  local_3f8._M_allocated_capacity._4_4_ = barrierColorAttachmentSetInitialLayout.dstAccessMask;
  local_3f8._8_4_ = barrierColorAttachmentSetInitialLayout.oldLayout;
  local_3f8._12_4_ = barrierColorAttachmentSetInitialLayout.newLayout;
  local_408._0_8_ = barrierColorAttachmentSetInitialLayout._0_8_;
  local_408._8_8_ = barrierColorAttachmentSetInitialLayout.pNext;
  renderArea.offset.x = 0;
  renderArea.offset.y = 0;
  renderArea.extent.width = renderSize.m_data[0];
  renderArea.extent.height = renderSize.m_data[1];
  clearColor.m_data[0] = 0.0;
  clearColor.m_data[1] = 0.0;
  clearColor.m_data[2] = 0.0;
  clearColor.m_data[3] = 1.0;
  vertexBufferOffset = 0;
  beginCommandBuffer(vk,(VkCommandBuffer)commandBuffer.m_data);
  subresourceRange_00.levelCount = 1;
  subresourceRange_00.aspectMask = 1;
  subresourceRange_00.baseMipLevel = 0;
  subresourceRange_00.baseArrayLayer = 0;
  subresourceRange_00.layerCount = 1;
  makeImageMemoryBarrier
            (&barrierColorAttachmentSetInitialLayout,0,0x100,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
             (VkImage)colorImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object
                      .m_internal,subresourceRange_00);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,commandBuffer.m_data,0x4000,0x400,0,0,0,0,0,1,
             (int)&barrierColorAttachmentSetInitialLayout);
  beginRenderPass(vk,(VkCommandBuffer)commandBuffer.m_data,local_348,local_168,&renderArea,
                  &clearColor);
  (*vk->_vptr_DeviceInterface[0x4c])(vk,commandBuffer.m_data,0,local_408._0_8_);
  (*vk->_vptr_DeviceInterface[0x56])
            (vk,commandBuffer.m_data,0,pipelineLayout.m_data,0,1,(int)local_368,0,0);
  (*vk->_vptr_DeviceInterface[0x58])(vk,commandBuffer.m_data,0,1,&vertexBuffer,&vertexBufferOffset);
  (*vk->_vptr_DeviceInterface[0x59])(vk,commandBuffer.m_data,3,1,0,0);
  (*vk->_vptr_DeviceInterface[0x76])(vk,commandBuffer.m_data);
  makeBufferMemoryBarrier
            ((VkBufferMemoryBarrier *)&barrierColorAttachmentSetInitialLayout,0x40,0x2000,
             (VkBuffer)
             resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,0,this->m_ssboSize);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,commandBuffer.m_data,0x8000,0x4000,0,0,0,1,
             (int)&barrierColorAttachmentSetInitialLayout,0,0);
  result = (*vk->_vptr_DeviceInterface[0x4a])(vk,commandBuffer.m_data);
  ::vk::checkResult(result,"vk.endCommandBuffer(*cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineSpecConstantTests.cpp"
                    ,0x2ad);
  submitCommandsAndWait(vk,device,local_328,(VkCommandBuffer)commandBuffer.m_data);
  pAVar6 = resultBuffer.m_allocation.
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::invalidateMappedMemoryRange
            (vk,device,
             (VkDeviceMemory)
             ((resultBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (resultBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,this->m_ssboSize);
  bVar7 = verifyValues(((this->super_TestInstance).m_context)->m_testCtx->m_log,pAVar6->m_hostPtr,
                       &this->m_expectedValues);
  if (bVar7) {
    barrierColorAttachmentSetInitialLayout._0_8_ =
         &barrierColorAttachmentSetInitialLayout.srcAccessMask;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&barrierColorAttachmentSetInitialLayout,"Success","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,
               barrierColorAttachmentSetInitialLayout._0_8_,
               (long)barrierColorAttachmentSetInitialLayout.pNext +
               barrierColorAttachmentSetInitialLayout._0_8_);
  }
  else {
    barrierColorAttachmentSetInitialLayout._0_8_ =
         &barrierColorAttachmentSetInitialLayout.srcAccessMask;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&barrierColorAttachmentSetInitialLayout,"Values did not match","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,
               barrierColorAttachmentSetInitialLayout._0_8_,
               (long)barrierColorAttachmentSetInitialLayout.pNext +
               barrierColorAttachmentSetInitialLayout._0_8_);
  }
  if ((VkAccessFlags *)barrierColorAttachmentSetInitialLayout._0_8_ !=
      &barrierColorAttachmentSetInitialLayout.srcAccessMask) {
    operator_delete((void *)barrierColorAttachmentSetInitialLayout._0_8_,
                    barrierColorAttachmentSetInitialLayout._16_8_ + 1);
  }
  if ((pointer)local_408._0_8_ != (pointer)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)18>_> *)(local_408 + 8),
               (VkPipeline)local_408._0_8_);
  }
  GraphicsPipelineBuilder::~GraphicsPipelineBuilder(&pipelineBuilder);
  if (commandBuffer.m_data != (int  [2])0x0) {
    pipelineBuilder.m_renderSize = commandBuffer;
    (**(code **)(*(long *)HVar3.m_internal + 0x240))(HVar3.m_internal,pDVar4,pVVar5,1);
  }
  if (obj.m_data != (int  [2])0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              (&DStack_180,(VkCommandPool)obj.m_data);
  }
  if (pipelineLayout.m_data != (int  [2])0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              (&DStack_2c0,(VkPipelineLayout)pipelineLayout.m_data);
  }
  if (local_168.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()(&DStack_160,local_168);
  }
  if (local_348.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()(&DStack_340,local_348);
  }
  if (specialization.m_entries.
      super__Vector_base<vk::VkSpecializationMapEntry,_std::allocator<vk::VkSpecializationMapEntry>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(specialization.m_entries.
                    super__Vector_base<vk::VkSpecializationMapEntry,_std::allocator<vk::VkSpecializationMapEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)specialization.m_entries.
                          super__Vector_base<vk::VkSpecializationMapEntry,_std::allocator<vk::VkSpecializationMapEntry>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)specialization.m_entries.
                          super__Vector_base<vk::VkSpecializationMapEntry,_std::allocator<vk::VkSpecializationMapEntry>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (specialization.m_data.
      super__Vector_base<vkt::pipeline::(anonymous_namespace)::GenericValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::GenericValue>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(specialization.m_data.
                    super__Vector_base<vkt::pipeline::(anonymous_namespace)::GenericValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::GenericValue>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)specialization.m_data.
                          super__Vector_base<vkt::pipeline::(anonymous_namespace)::GenericValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::GenericValue>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)specialization.m_data.
                          super__Vector_base<vkt::pipeline::(anonymous_namespace)::GenericValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::GenericValue>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_368 != (int  [2])0x0) {
    pipelineBuilder.m_renderSize.m_data[0] = local_368[0];
    pipelineBuilder.m_renderSize.m_data[1] = local_368[1];
    (**(code **)(*plStack_360 + 0x1e8))(plStack_360,local_358,pVStack_350,1);
  }
  if (local_148.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()(&DStack_140,local_148);
  }
  if (local_2a8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()(&DStack_2a0,local_2a8);
  }
  if (resultBuffer.m_allocation.
      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr !=
      (Allocation *)0x0) {
    (*(resultBuffer.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
      _vptr_Allocation[1])();
    resultBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if (resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
      != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  if (vertexBuffer.m_allocation.
      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr !=
      (Allocation *)0x0) {
    (*(vertexBuffer.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
      _vptr_Allocation[1])();
    vertexBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if (vertexBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
      != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&vertexBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               vertexBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  if (local_f8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()(&DStack_f0,local_f8);
  }
  if (colorImage.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr != (Allocation *)0x0) {
    (*(colorImage.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
       .m_data.ptr)->_vptr_Allocation[1])();
    colorImage.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if (colorImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal != 0
     ) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&colorImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
               (VkImage)colorImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                        object.m_internal);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus GraphicsTestInstance::iterate (void)
{
	const DeviceInterface&	vk					= m_context.getDeviceInterface();
	const VkDevice			device				= m_context.getDevice();
	const VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= m_context.getDefaultAllocator();

	// Color attachment

	const tcu::IVec2          renderSize    = tcu::IVec2(32, 32);
	const VkFormat            imageFormat   = VK_FORMAT_R8G8B8A8_UNORM;
	const Image               colorImage    (vk, device, allocator, makeImageCreateInfo(renderSize, imageFormat, VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT), MemoryRequirement::Any);
	const Unique<VkImageView> colorImageView(makeImageView(vk, device, *colorImage, VK_IMAGE_VIEW_TYPE_2D, imageFormat, makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u)));

	// Vertex buffer

	const deUint32     numVertices           = 3;
	const VkDeviceSize vertexBufferSizeBytes = sizeof(tcu::Vec4) * numVertices;
	const Buffer       vertexBuffer          (vk, device, allocator, makeBufferCreateInfo(vertexBufferSizeBytes, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT), MemoryRequirement::HostVisible);

	{
		const Allocation& alloc = vertexBuffer.getAllocation();
		tcu::Vec4* pVertices = reinterpret_cast<tcu::Vec4*>(alloc.getHostPtr());

		pVertices[0] = tcu::Vec4(-1.0f, -1.0f,  0.0f,  1.0f);
		pVertices[1] = tcu::Vec4(-1.0f,  1.0f,  0.0f,  1.0f);
		pVertices[2] = tcu::Vec4( 1.0f, -1.0f,  0.0f,  1.0f);

		flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), vertexBufferSizeBytes);
		// No barrier needed, flushed memory is automatically visible
	}

	// Descriptors

	const Buffer resultBuffer(vk, device, allocator, makeBufferCreateInfo(m_ssboSize, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	const Unique<VkDescriptorSetLayout> descriptorSetLayout(DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_ALL_GRAPHICS)
		.build(vk, device));

	const Unique<VkDescriptorPool> descriptorPool(DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet> descriptorSet        (makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout));
	const VkDescriptorBufferInfo  descriptorBufferInfo = makeDescriptorBufferInfo(resultBuffer.get(), 0ull, m_ssboSize);

	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &descriptorBufferInfo)
		.update(vk, device);

	// Specialization

	const Specialization        specialization (m_specConstants);
	const VkSpecializationInfo* pSpecInfo      = specialization.getSpecializationInfo();

	// Pipeline

	const Unique<VkRenderPass>     renderPass    (makeRenderPass    (vk, device, imageFormat));
	const Unique<VkFramebuffer>    framebuffer   (makeFramebuffer	(vk, device, *renderPass, 1u, &colorImageView.get(), static_cast<deUint32>(renderSize.x()), static_cast<deUint32>(renderSize.y())));
	const Unique<VkPipelineLayout> pipelineLayout(makePipelineLayout(vk, device, *descriptorSetLayout));
	const Unique<VkCommandPool>    cmdPool       (createCommandPool (vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Unique<VkCommandBuffer>  cmdBuffer     (makeCommandBuffer (vk, device, *cmdPool));

	GraphicsPipelineBuilder pipelineBuilder;
	pipelineBuilder
		.setRenderSize(renderSize)
		.setShader(vk, device, VK_SHADER_STAGE_VERTEX_BIT,   m_context.getBinaryCollection().get("vert"), pSpecInfo)
		.setShader(vk, device, VK_SHADER_STAGE_FRAGMENT_BIT, m_context.getBinaryCollection().get("frag"), pSpecInfo);

	if ((m_stage == VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT) || (m_stage == VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT))
		pipelineBuilder
			.setShader(vk, device, VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,    m_context.getBinaryCollection().get("tesc"), pSpecInfo)
			.setShader(vk, device, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT, m_context.getBinaryCollection().get("tese"), pSpecInfo);

	if (m_stage == VK_SHADER_STAGE_GEOMETRY_BIT)
		pipelineBuilder
			.setShader(vk, device, VK_SHADER_STAGE_GEOMETRY_BIT, m_context.getBinaryCollection().get("geom"), pSpecInfo);

	const Unique<VkPipeline> pipeline (pipelineBuilder.build(vk, device, *pipelineLayout, *renderPass));

	// Draw commands

	const VkRect2D renderArea = {
		makeOffset2D(0, 0),
		makeExtent2D(renderSize.x(), renderSize.y()),
	};
	const tcu::Vec4    clearColor         (0.0f, 0.0f, 0.0f, 1.0f);
	const VkDeviceSize vertexBufferOffset = 0ull;

	beginCommandBuffer(vk, *cmdBuffer);

	{
		const VkImageSubresourceRange imageFullSubresourceRange              = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u);
		const VkImageMemoryBarrier    barrierColorAttachmentSetInitialLayout = makeImageMemoryBarrier(
			0u, VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,
			VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
			*colorImage, imageFullSubresourceRange);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, 0u,
			0u, DE_NULL, 0u, DE_NULL, 1u, &barrierColorAttachmentSetInitialLayout);
	}

	beginRenderPass(vk, *cmdBuffer, *renderPass, *framebuffer, renderArea, clearColor);

	vk.cmdBindPipeline      (*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);
	vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);
	vk.cmdBindVertexBuffers (*cmdBuffer, 0u, 1u, &vertexBuffer.get(), &vertexBufferOffset);

	vk.cmdDraw(*cmdBuffer, numVertices, 1u, 0u, 0u);
	vk.cmdEndRenderPass(*cmdBuffer);

	{
		const VkBufferMemoryBarrier shaderWriteBarrier = makeBufferMemoryBarrier(
			VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *resultBuffer, 0ull, m_ssboSize);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
			0u, DE_NULL, 1u, &shaderWriteBarrier, 0u, DE_NULL);
	}

	VK_CHECK(vk.endCommandBuffer(*cmdBuffer));
	submitCommandsAndWait(vk, device, queue, *cmdBuffer);

	// Verify results

	const Allocation& resultAlloc = resultBuffer.getAllocation();
	invalidateMappedMemoryRange(vk, device, resultAlloc.getMemory(), resultAlloc.getOffset(), m_ssboSize);

	if (verifyValues(m_context.getTestContext().getLog(), resultAlloc.getHostPtr(), m_expectedValues))
		return tcu::TestStatus::pass("Success");
	else
		return tcu::TestStatus::fail("Values did not match");
}